

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::CFLSubsampleHBDTest_SubsampleHBD444Test_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::CFLSubsampleHBDTest_SubsampleHBD444Test_Test>
           *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_unsigned_short_*,_int,_unsigned_short_*),_void_(*(*)(unsigned_char))(const_unsigned_short_*,_int,_unsigned_short_*),_void_(*(*)(unsigned_char))(const_unsigned_short_*,_int,_unsigned_short_*)>_>
  ::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x1060);
  anon_unknown.dwarf_15b07f::CFLSubsampleHBDTest_SubsampleHBD444Test_Test::
  CFLSubsampleHBDTest_SubsampleHBD444Test_Test
            ((CFLSubsampleHBDTest_SubsampleHBD444Test_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }